

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFtpCommand.h
# Opt level: O2

void __thiscall CMKDCommand::CMKDCommand(CMKDCommand *this)

{
  (this->super_CCommand).m_Command._M_dataplus._M_p =
       (pointer)&(this->super_CCommand).m_Command.field_2;
  (this->super_CCommand).m_Command._M_string_length = 0;
  (this->super_CCommand).m_Command.field_2._M_local_buf[0] = '\0';
  (this->super_CCommand).m_Args._M_dataplus._M_p = (pointer)&(this->super_CCommand).m_Args.field_2;
  (this->super_CCommand).m_Args._M_string_length = 0;
  (this->super_CCommand).m_Args.field_2._M_local_buf[0] = '\0';
  (this->super_CCommand)._vptr_CCommand = (_func_int **)&PTR_MatchCommand_001288f8;
  std::__cxx11::string::assign((char *)&(this->super_CCommand).m_Command);
  return;
}

Assistant:

CMKDCommand(){m_Command = "MKD";}